

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdstring.cpp
# Opt level: O0

SQInteger sqstd_register_stringlib(HSQUIRRELVM v)

{
  undefined8 in_RDI;
  SQRegFunction *f;
  SQInteger i;
  long local_10;
  
  sq_pushstring(in_RDI,"regexp",0xffffffffffffffff);
  sq_newclass(in_RDI,0);
  for (local_10 = 0; rexobj_funcs[local_10].name != (SQChar *)0x0; local_10 = local_10 + 1) {
    sq_pushstring(in_RDI,rexobj_funcs[local_10].name,0xffffffffffffffff);
    sq_newclosure(in_RDI,rexobj_funcs[local_10].f,0);
    sq_setparamscheck(in_RDI,rexobj_funcs[local_10].nparamscheck,rexobj_funcs[local_10].typemask);
    sq_setnativeclosurename(in_RDI,0xffffffffffffffff,rexobj_funcs[local_10].name);
    sq_newslot(in_RDI,0xfffffffffffffffd,0);
  }
  sq_newslot(in_RDI,0xfffffffffffffffd,0);
  for (local_10 = 0; stringlib_funcs[local_10].name != (SQChar *)0x0; local_10 = local_10 + 1) {
    sq_pushstring(in_RDI,stringlib_funcs[local_10].name,0xffffffffffffffff);
    sq_newclosure(in_RDI,stringlib_funcs[local_10].f,0);
    sq_setparamscheck(in_RDI,stringlib_funcs[local_10].nparamscheck,
                      stringlib_funcs[local_10].typemask);
    sq_setnativeclosurename(in_RDI,0xffffffffffffffff,stringlib_funcs[local_10].name);
    sq_newslot(in_RDI,0xfffffffffffffffd,0);
  }
  return 1;
}

Assistant:

SQInteger sqstd_register_stringlib(HSQUIRRELVM v)
{
    sq_pushstring(v,_SC("regexp"),-1);
    sq_newclass(v,SQFalse);
    SQInteger i = 0;
    while(rexobj_funcs[i].name != 0) {
        const SQRegFunction &f = rexobj_funcs[i];
        sq_pushstring(v,f.name,-1);
        sq_newclosure(v,f.f,0);
        sq_setparamscheck(v,f.nparamscheck,f.typemask);
        sq_setnativeclosurename(v,-1,f.name);
        sq_newslot(v,-3,SQFalse);
        i++;
    }
    sq_newslot(v,-3,SQFalse);

    i = 0;
    while(stringlib_funcs[i].name!=0)
    {
        sq_pushstring(v,stringlib_funcs[i].name,-1);
        sq_newclosure(v,stringlib_funcs[i].f,0);
        sq_setparamscheck(v,stringlib_funcs[i].nparamscheck,stringlib_funcs[i].typemask);
        sq_setnativeclosurename(v,-1,stringlib_funcs[i].name);
        sq_newslot(v,-3,SQFalse);
        i++;
    }
    return 1;
}